

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

void __thiscall CTxMemPool::removeConflicts(CTxMemPool *this,CTransaction *tx)

{
  pointer pCVar1;
  CTransaction *origTx;
  iterator iVar2;
  CTxIn *txin;
  pointer pCVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>_>
  pVar6;
  pointer local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar3 != pCVar1) {
    do {
      local_40 = pCVar3;
      iVar2 = std::
              _Rb_tree<const_COutPoint_*,_std::pair<const_COutPoint_*const,_const_CTransaction_*>,_std::_Select1st<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>,_DereferencingComparator<const_COutPoint_*>,_std::allocator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>_>
              ::find((_Rb_tree<const_COutPoint_*,_std::pair<const_COutPoint_*const,_const_CTransaction_*>,_std::_Select1st<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>,_DereferencingComparator<const_COutPoint_*>,_std::allocator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>_>
                      *)&this->mapNextTx,(key_type *)&local_40);
      if ((_Rb_tree_header *)iVar2._M_node !=
          &(this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header) {
        origTx = (CTransaction *)iVar2._M_node[1]._M_parent;
        auVar5[0] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
        auVar5[1] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
        auVar5[2] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
        auVar5[3] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
        auVar5[4] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
        auVar5[5] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
        auVar5[6] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
        auVar5[7] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
        auVar5[8] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
        auVar5[9] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
        auVar5[10] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                      (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
        auVar5[0xb] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar5[0xc] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar5[0xd] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar5[0xe] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar5[0xf] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar4[0] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar4[1] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar4[2] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar4[3] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar4[4] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar4[5] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar4[6] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar4[7] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar4[8] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar4[9] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                     (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar4[10] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                      (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar4[0xb] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar4[0xc] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar4[0xd] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar4[0xe] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar4[0xf] = -((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                       (origTx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar4 = auVar4 & auVar5;
        if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) {
          pVar6 = std::
                  _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                  ::equal_range(&(this->mapDeltas)._M_t,&(origTx->hash).m_wrapped);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
          ::_M_erase_aux(&(this->mapDeltas)._M_t,(_Base_ptr)pVar6.first._M_node,
                         (_Base_ptr)pVar6.second._M_node);
          removeRecursive(this,origTx,CONFLICT);
        }
      }
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::removeConflicts(const CTransaction &tx)
{
    // Remove transactions which depend on inputs of tx, recursively
    AssertLockHeld(cs);
    for (const CTxIn &txin : tx.vin) {
        auto it = mapNextTx.find(txin.prevout);
        if (it != mapNextTx.end()) {
            const CTransaction &txConflict = *it->second;
            if (txConflict != tx)
            {
                ClearPrioritisation(txConflict.GetHash());
                removeRecursive(txConflict, MemPoolRemovalReason::CONFLICT);
            }
        }
    }
}